

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_NtkNewStrId(Cba_Ntk_t *pNtk,char *format,...)

{
  Abc_Nam_t *p;
  char in_AL;
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __size;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  p = pNtk->pDesign->pStrs;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pVVar4 = Abc_NamBuffer(p);
  local_100 = &args[0].overflow_arg_area;
  local_108 = 0x3000000010;
  iVar3 = pVVar4->nSize;
  __size = (long)iVar3 + 1000;
  pcVar5 = pVVar4->pArray;
  local_f8 = local_e8;
  if (pVVar4->nCap < (int)__size) {
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)malloc(__size);
    }
    else {
      pcVar5 = (char *)realloc(pcVar5,__size);
      iVar3 = pVVar4->nSize;
    }
    pVVar4->pArray = pcVar5;
    pVVar4->nCap = (int)__size;
  }
  uVar1 = vsnprintf(pcVar5 + iVar3,1000,format,&local_108);
  if (1000 < (int)uVar1) {
    iVar3 = pVVar4->nSize;
    iVar6 = uVar1 + iVar3 + 1000;
    pcVar5 = pVVar4->pArray;
    if (pVVar4->nCap < iVar6) {
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)malloc((long)iVar6);
      }
      else {
        pcVar5 = (char *)realloc(pcVar5,(long)iVar6);
        iVar3 = pVVar4->nSize;
      }
      pVVar4->pArray = pcVar5;
      pVVar4->nCap = iVar6;
    }
    uVar2 = vsnprintf(pcVar5 + iVar3,(ulong)uVar1,format,&local_108);
    if (uVar2 != uVar1) {
      __assert_fail("nSize == nAdded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x24d,"int Cba_NtkNewStrId(Cba_Ntk_t *, const char *, ...)");
    }
  }
  iVar3 = Abc_NamStrFindOrAddLim
                    (p,pVVar4->pArray + pVVar4->nSize,pVVar4->pArray + pVVar4->nSize + (int)uVar1,
                     (int *)0x0);
  return iVar3;
}

Assistant:

static inline int Cba_NtkNewStrId( Cba_Ntk_t * pNtk, const char * format, ...  )
{
    Abc_Nam_t * p = Cba_NtkNam( pNtk );
    Vec_Str_t * vBuf = Abc_NamBuffer( p );
    int nAdded, nSize = 1000; 
    va_list args;   va_start( args, format );
    Vec_StrGrow( vBuf, Vec_StrSize(vBuf) + nSize );
    nAdded = vsnprintf( Vec_StrLimit(vBuf), nSize, format, args );
    if ( nAdded > nSize )
    {
        Vec_StrGrow( vBuf, Vec_StrSize(vBuf) + nAdded + nSize );
        nSize = vsnprintf( Vec_StrLimit(vBuf), nAdded, format, args );
        assert( nSize == nAdded );
    }
    va_end( args );
    return Abc_NamStrFindOrAddLim( p, Vec_StrLimit(vBuf), Vec_StrLimit(vBuf) + nAdded, NULL );
}